

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O2

Abc_Obj_t *
Abc_NodeBalance_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNodeOld,Vec_Vec_t *vStorage,int Level,
                   int fDuplicate,int fSelective,int fUpdateLevel)

{
  uint *puVar1;
  Abc_Aig_t *pMan;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *p1;
  uint uVar5;
  long lVar6;
  
  if (((ulong)pNodeOld & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0xf7,
                  "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                 );
  }
  pAVar4 = (Abc_Obj_t *)(pNodeOld->field_6).pTemp;
  if (pAVar4 == (Abc_Obj_t *)0x0) {
    if ((*(uint *)&pNodeOld->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNodeOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                    ,0xfb,
                    "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                   );
    }
    pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
    if (vStorage->nSize <= Level) {
      Vec_PtrGrow((Vec_Ptr_t *)vStorage,Level + 1);
      for (lVar6 = (long)vStorage->nSize; lVar6 <= Level; lVar6 = lVar6 + 1) {
        pVVar3 = Vec_PtrAlloc(0);
        vStorage->pArray[lVar6] = pVVar3;
      }
      vStorage->nSize = Level + 1;
      pVVar3 = Vec_VecEntry(vStorage,Level);
      Vec_PtrPush(pVVar3,(void *)0x0);
    }
    pVVar3 = Vec_VecEntry(vStorage,Level);
    pVVar3->nSize = 0;
    iVar2 = Abc_NodeBalanceCone_rec(pNodeOld,pVVar3,1,fDuplicate,fSelective);
    uVar5 = pVVar3->nSize;
    if ((int)uVar5 < 2) {
      __assert_fail("vNodes->nSize > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                    ,0x140,"Vec_Ptr_t *Abc_NodeBalanceCone(Abc_Obj_t *, Vec_Vec_t *, int, int, int)"
                   );
    }
    for (lVar6 = 0; lVar6 < (int)uVar5; lVar6 = lVar6 + 1) {
      puVar1 = (uint *)(((ulong)pVVar3->pArray[lVar6] & 0xfffffffffffffffe) + 0x14);
      *puVar1 = *puVar1 & 0xffffffdf;
      uVar5 = pVVar3->nSize;
    }
    if (iVar2 == -1) {
      pVVar3->nSize = 0;
    }
    else if (uVar5 != 0) {
      for (lVar6 = 0; lVar6 < (int)uVar5; lVar6 = lVar6 + 1) {
        pAVar4 = Abc_NodeBalance_rec(pNtkNew,(Abc_Obj_t *)
                                             ((ulong)pVVar3->pArray[lVar6] & 0xfffffffffffffffe),
                                     vStorage,Level + 1,fDuplicate,fSelective,fUpdateLevel);
        pVVar3->pArray[lVar6] = (void *)((ulong)((uint)pVVar3->pArray[lVar6] & 1) ^ (ulong)pAVar4);
        uVar5 = pVVar3->nSize;
      }
      if ((int)uVar5 < 2) {
        puts("BUG!");
        uVar5 = pVVar3->nSize;
        if ((int)uVar5 < 2) goto LAB_00263c7a;
      }
      qsort(pVVar3->pArray,(ulong)uVar5,8,Abc_NodeCompareLevelsDecrease);
      iVar2 = pVVar3->nSize;
      if (1 < iVar2) {
        while (1 < iVar2) {
          if (fUpdateLevel == 0) {
            iVar2 = 0;
          }
          else {
            iVar2 = Abc_NodeBalanceFindLeft(pVVar3);
          }
          Abc_NodeBalancePermute(pNtkNew,pVVar3,iVar2);
          pAVar4 = (Abc_Obj_t *)Vec_PtrPop(pVVar3);
          p1 = (Abc_Obj_t *)Vec_PtrPop(pVVar3);
          pAVar4 = Abc_AigAnd(pMan,pAVar4,p1);
          Abc_VecObjPushUniqueOrderByLevel(pVVar3,pAVar4);
          iVar2 = pVVar3->nSize;
        }
        if ((pNodeOld->field_6).pTemp == (void *)0x0) {
          pNodeOld->field_6 = *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)pVVar3->pArray;
          pVVar3->nSize = 0;
          return (Abc_Obj_t *)(pNodeOld->field_6).pTemp;
        }
        __assert_fail("pNodeOld->pCopy == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                      ,0x11c,
                      "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                     );
      }
LAB_00263c7a:
      __assert_fail("vSuper->nSize > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                    ,0x10f,
                    "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                   );
    }
    pAVar4 = Abc_AigConst1(pNtkNew);
    pAVar4 = (Abc_Obj_t *)((ulong)pAVar4 ^ 1);
    (pNodeOld->field_6).pTemp = pAVar4;
  }
  return pAVar4;
}

Assistant:

Abc_Obj_t * Abc_NodeBalance_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNodeOld, Vec_Vec_t * vStorage, int Level, int fDuplicate, int fSelective, int fUpdateLevel )
{
    Abc_Aig_t * pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
    Abc_Obj_t * pNodeNew, * pNode1, * pNode2;
    Vec_Ptr_t * vSuper;
    int i, LeftBound;
    assert( !Abc_ObjIsComplement(pNodeOld) );
    // return if the result if known
    if ( pNodeOld->pCopy )
        return pNodeOld->pCopy;
    assert( Abc_ObjIsNode(pNodeOld) );
    // get the implication supergate
//    Abc_NodeBalanceConeExor( pNodeOld );
    vSuper = Abc_NodeBalanceCone( pNodeOld, vStorage, Level, fDuplicate, fSelective );
    if ( vSuper->nSize == 0 )
    { // it means that the supergate contains two nodes in the opposite polarity
        pNodeOld->pCopy = Abc_ObjNot(Abc_AigConst1(pNtkNew));
        return pNodeOld->pCopy;
    }
    // for each old node, derive the new well-balanced node
    for ( i = 0; i < vSuper->nSize; i++ )
    {
        pNodeNew = Abc_NodeBalance_rec( pNtkNew, Abc_ObjRegular((Abc_Obj_t *)vSuper->pArray[i]), vStorage, Level + 1, fDuplicate, fSelective, fUpdateLevel );
        vSuper->pArray[i] = Abc_ObjNotCond( pNodeNew, Abc_ObjIsComplement((Abc_Obj_t *)vSuper->pArray[i]) );
    }
    if ( vSuper->nSize < 2 )
        printf( "BUG!\n" );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Abc_NodeCompareLevelsDecrease );
    // balance the nodes
    assert( vSuper->nSize > 1 );
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Abc_NodeBalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Abc_NodeBalancePermute( pNtkNew, vSuper, LeftBound );
        // pull out the last two nodes
        pNode1 = (Abc_Obj_t *)Vec_PtrPop(vSuper);
        pNode2 = (Abc_Obj_t *)Vec_PtrPop(vSuper);
        Abc_VecObjPushUniqueOrderByLevel( vSuper, Abc_AigAnd(pMan, pNode1, pNode2) );
    }
    // make sure the balanced node is not assigned
    assert( pNodeOld->pCopy == NULL );
    // mark the old node with the new node
    pNodeOld->pCopy = (Abc_Obj_t *)vSuper->pArray[0];
    vSuper->nSize = 0;
//    if ( Abc_ObjRegular(pNodeOld->pCopy) == Abc_AigConst1(pNtkNew) )
//        printf( "Constant node\n" );
//    assert( pNodeOld->Level >= Abc_ObjRegular(pNodeOld->pCopy)->Level );
    return pNodeOld->pCopy;
}